

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_4_quad_sse2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ulong *puVar26;
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  int iVar27;
  longlong in_RSI;
  ulong *in_RDI;
  undefined1 (*in_R8) [16];
  byte bVar28;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  ulong extraout_XMM0_Qa_02;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  byte bVar40;
  byte bVar41;
  byte bVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  byte bVar53;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  ulong extraout_XMM0_Qb_02;
  byte bVar54;
  undefined1 auVar33 [16];
  ulong uVar42;
  byte bVar55;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  undefined1 auVar56 [16];
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i alVar57;
  __m128i filter2;
  __m128i filter1;
  __m128i work_a;
  __m128i filt;
  __m128i ff_1;
  __m128i t7f;
  __m128i t1;
  __m128i t1f;
  __m128i te0;
  __m128i t80;
  __m128i t3;
  __m128i t4;
  __m128i abs_p1q1;
  __m128i abs_p0q0;
  __m128i ff;
  __m128i fe;
  __m128i abs_q1q0;
  __m128i abs_p1p0;
  __m128i max_abs_p1p0q1q0;
  __m128i oq1;
  __m128i oq0;
  __m128i op0;
  __m128i op1;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i hev;
  __m128i mask;
  __m128i thresh_v;
  __m128i limit_v;
  __m128i blimit_v;
  __m128i zero;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_948;
  undefined8 uStack_940;
  char local_7e8;
  char cStack_7e7;
  char cStack_7e6;
  char cStack_7e5;
  char cStack_7e4;
  char cStack_7e3;
  char cStack_7e2;
  char cStack_7e1;
  char cStack_7e0;
  char cStack_7df;
  char cStack_7de;
  char cStack_7dd;
  char cStack_7dc;
  char cStack_7db;
  char cStack_7da;
  char cStack_7d9;
  char local_788;
  char cStack_787;
  char cStack_786;
  char cStack_785;
  char cStack_784;
  char cStack_783;
  char cStack_782;
  char cStack_781;
  char cStack_780;
  char cStack_77f;
  char cStack_77e;
  char cStack_77d;
  char cStack_77c;
  char cStack_77b;
  char cStack_77a;
  char cStack_779;
  char local_768;
  char cStack_767;
  char cStack_766;
  char cStack_765;
  char cStack_764;
  char cStack_763;
  char cStack_762;
  char cStack_761;
  char cStack_760;
  char cStack_75f;
  char cStack_75e;
  char cStack_75d;
  char cStack_75c;
  char cStack_75b;
  char cStack_75a;
  char cStack_759;
  byte local_738;
  byte bStack_737;
  byte bStack_736;
  byte bStack_735;
  byte bStack_734;
  byte bStack_733;
  byte bStack_732;
  byte bStack_731;
  byte bStack_730;
  byte bStack_72f;
  byte bStack_72e;
  byte bStack_72d;
  byte bStack_72c;
  byte bStack_72b;
  byte bStack_72a;
  byte bStack_729;
  byte local_718;
  byte bStack_717;
  byte bStack_716;
  byte bStack_715;
  byte bStack_714;
  byte bStack_713;
  byte bStack_712;
  byte bStack_711;
  byte bStack_710;
  byte bStack_70f;
  byte bStack_70e;
  byte bStack_70d;
  byte bStack_70c;
  byte bStack_70b;
  byte bStack_70a;
  byte bStack_709;
  byte local_708;
  byte bStack_707;
  byte bStack_706;
  byte bStack_705;
  byte bStack_704;
  byte bStack_703;
  byte bStack_702;
  byte bStack_701;
  byte bStack_700;
  byte bStack_6ff;
  byte bStack_6fe;
  byte bStack_6fd;
  byte bStack_6fc;
  byte bStack_6fb;
  byte bStack_6fa;
  byte bStack_6f9;
  ushort local_6a8;
  ushort uStack_6a6;
  ushort uStack_6a4;
  ushort uStack_6a2;
  ushort uStack_6a0;
  ushort uStack_69e;
  ushort uStack_69c;
  ushort uStack_69a;
  ushort local_688;
  ushort uStack_686;
  ushort uStack_684;
  ushort uStack_682;
  ushort uStack_680;
  ushort uStack_67e;
  ushort uStack_67c;
  ushort uStack_67a;
  ushort local_668;
  ushort uStack_666;
  ushort uStack_664;
  ushort uStack_662;
  ushort uStack_660;
  ushort uStack_65e;
  ushort uStack_65c;
  ushort uStack_65a;
  ushort local_648;
  ushort uStack_646;
  ushort uStack_644;
  ushort uStack_642;
  ushort uStack_640;
  ushort uStack_63e;
  ushort uStack_63c;
  ushort uStack_63a;
  ulong local_548;
  ulong uStack_540;
  ulong local_4a8;
  ulong uStack_4a0;
  ulong local_488;
  ulong uStack_480;
  ulong local_468;
  ulong uStack_460;
  ulong local_448;
  ulong uStack_440;
  char local_1e8;
  char cStack_1e7;
  char cStack_1e6;
  char cStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  char cStack_1e1;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char cStack_1d9;
  char local_1c8;
  char cStack_1c7;
  char cStack_1c6;
  char cStack_1c5;
  char cStack_1c4;
  char cStack_1c3;
  char cStack_1c2;
  char cStack_1c1;
  char cStack_1c0;
  char cStack_1bf;
  char cStack_1be;
  char cStack_1bd;
  char cStack_1bc;
  char cStack_1bb;
  char cStack_1ba;
  char cStack_1b9;
  char local_1a8;
  char cStack_1a7;
  char cStack_1a6;
  char cStack_1a5;
  char cStack_1a4;
  char cStack_1a3;
  char cStack_1a2;
  char cStack_1a1;
  char cStack_1a0;
  char cStack_19f;
  char cStack_19e;
  char cStack_19d;
  char cStack_19c;
  char cStack_19b;
  char cStack_19a;
  char cStack_199;
  uint local_128;
  uint uStack_124;
  uint uStack_120;
  uint uStack_11c;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  
  iVar27 = (int)in_RSI;
  auVar5 = *in_RDX;
  auVar6 = *in_RCX;
  auVar7 = *in_R8;
  puVar26 = (ulong *)((long)in_RDI - (long)(iVar27 * 2));
  uVar30 = *puVar26;
  uVar43 = puVar26[1];
  uVar31 = *(ulong *)((long)in_RDI - (long)iVar27);
  uVar44 = ((ulong *)((long)in_RDI - (long)iVar27))[1];
  uVar1 = *in_RDI;
  uVar2 = in_RDI[1];
  b[1] = (long)iVar27;
  uVar32 = *(ulong *)((long)in_RDI + b[1]);
  uVar45 = ((ulong *)((long)in_RDI + b[1]))[1];
  b[0] = (longlong)in_RDX;
  a[1] = in_RSI;
  a[0] = (longlong)in_RDI;
  puVar26 = in_RDI;
  alVar57 = abs_diff(a,b);
  alVar57[0] = alVar57[1];
  alVar57[1] = b[1];
  a_00[1] = in_RSI;
  a_00[0] = (longlong)puVar26;
  alVar57 = abs_diff(a_00,alVar57);
  b_00[0] = alVar57[1];
  b_00[1] = b[1];
  a_01[1] = in_RSI;
  a_01[0] = (longlong)puVar26;
  alVar57 = abs_diff(a_01,b_00);
  b_01[0] = alVar57[1];
  b_01[1] = b[1];
  a_02[1] = in_RSI;
  a_02[0] = (longlong)puVar26;
  abs_diff(a_02,b_01);
  local_708 = (byte)extraout_XMM0_Qa;
  bStack_707 = (byte)((ulong)extraout_XMM0_Qa >> 8);
  bStack_706 = (byte)((ulong)extraout_XMM0_Qa >> 0x10);
  bStack_705 = (byte)((ulong)extraout_XMM0_Qa >> 0x18);
  bStack_704 = (byte)((ulong)extraout_XMM0_Qa >> 0x20);
  bStack_703 = (byte)((ulong)extraout_XMM0_Qa >> 0x28);
  bStack_702 = (byte)((ulong)extraout_XMM0_Qa >> 0x30);
  bStack_701 = (byte)((ulong)extraout_XMM0_Qa >> 0x38);
  bStack_700 = (byte)extraout_XMM0_Qb;
  bStack_6ff = (byte)((ulong)extraout_XMM0_Qb >> 8);
  bStack_6fe = (byte)((ulong)extraout_XMM0_Qb >> 0x10);
  bStack_6fd = (byte)((ulong)extraout_XMM0_Qb >> 0x18);
  bStack_6fc = (byte)((ulong)extraout_XMM0_Qb >> 0x20);
  bStack_6fb = (byte)((ulong)extraout_XMM0_Qb >> 0x28);
  bStack_6fa = (byte)((ulong)extraout_XMM0_Qb >> 0x30);
  bStack_6f9 = (byte)((ulong)extraout_XMM0_Qb >> 0x38);
  local_718 = (byte)extraout_XMM0_Qa_00;
  bStack_717 = (byte)((ulong)extraout_XMM0_Qa_00 >> 8);
  bStack_716 = (byte)((ulong)extraout_XMM0_Qa_00 >> 0x10);
  bStack_715 = (byte)((ulong)extraout_XMM0_Qa_00 >> 0x18);
  bStack_714 = (byte)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  bStack_713 = (byte)((ulong)extraout_XMM0_Qa_00 >> 0x28);
  bStack_712 = (byte)((ulong)extraout_XMM0_Qa_00 >> 0x30);
  bStack_711 = (byte)((ulong)extraout_XMM0_Qa_00 >> 0x38);
  bStack_710 = (byte)extraout_XMM0_Qb_00;
  bStack_70f = (byte)((ulong)extraout_XMM0_Qb_00 >> 8);
  bStack_70e = (byte)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  bStack_70d = (byte)((ulong)extraout_XMM0_Qb_00 >> 0x18);
  bStack_70c = (byte)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  bStack_70b = (byte)((ulong)extraout_XMM0_Qb_00 >> 0x28);
  bStack_70a = (byte)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  bStack_709 = (byte)((ulong)extraout_XMM0_Qb_00 >> 0x38);
  bVar28 = (local_708 < local_718) * local_718 | (local_708 >= local_718) * local_708;
  bVar34 = (bStack_707 < bStack_717) * bStack_717 | (bStack_707 >= bStack_717) * bStack_707;
  bVar35 = (bStack_706 < bStack_716) * bStack_716 | (bStack_706 >= bStack_716) * bStack_706;
  bVar36 = (bStack_705 < bStack_715) * bStack_715 | (bStack_705 >= bStack_715) * bStack_705;
  bVar37 = (bStack_704 < bStack_714) * bStack_714 | (bStack_704 >= bStack_714) * bStack_704;
  bVar38 = (bStack_703 < bStack_713) * bStack_713 | (bStack_703 >= bStack_713) * bStack_703;
  bVar39 = (bStack_702 < bStack_712) * bStack_712 | (bStack_702 >= bStack_712) * bStack_702;
  bVar40 = (bStack_701 < bStack_711) * bStack_711 | (bStack_701 >= bStack_711) * bStack_701;
  bVar41 = (bStack_700 < bStack_710) * bStack_710 | (bStack_700 >= bStack_710) * bStack_700;
  bVar48 = (bStack_6ff < bStack_70f) * bStack_70f | (bStack_6ff >= bStack_70f) * bStack_6ff;
  bVar49 = (bStack_6fe < bStack_70e) * bStack_70e | (bStack_6fe >= bStack_70e) * bStack_6fe;
  bVar50 = (bStack_6fd < bStack_70d) * bStack_70d | (bStack_6fd >= bStack_70d) * bStack_6fd;
  bVar51 = (bStack_6fc < bStack_70c) * bStack_70c | (bStack_6fc >= bStack_70c) * bStack_6fc;
  bVar52 = (bStack_6fb < bStack_70b) * bStack_70b | (bStack_6fb >= bStack_70b) * bStack_6fb;
  bVar53 = (bStack_6fa < bStack_70a) * bStack_70a | (bStack_6fa >= bStack_70a) * bStack_6fa;
  bVar54 = (bStack_6f9 < bStack_709) * bStack_709 | (bStack_6f9 >= bStack_709) * bStack_6f9;
  auVar3._8_8_ = extraout_XMM0_Qb_01;
  auVar3._0_8_ = extraout_XMM0_Qa_01;
  auVar33._8_8_ = extraout_XMM0_Qb_01;
  auVar33._0_8_ = extraout_XMM0_Qa_01;
  auVar33 = paddusb(auVar3,auVar33);
  uVar29 = extraout_XMM0_Qa_02 & 0xfefefefefefefefe;
  uVar42 = extraout_XMM0_Qb_02 & 0xfefefefefefefefe;
  local_648 = (ushort)uVar29;
  uStack_646 = (ushort)(uVar29 >> 0x10);
  uStack_644 = (ushort)(uVar29 >> 0x20);
  uStack_640 = (ushort)uVar42;
  uStack_63e = (ushort)(uVar42 >> 0x10);
  uStack_63c = (ushort)(uVar42 >> 0x20);
  local_a48 = CONCAT26((ushort)(uVar29 >> 0x31),
                       CONCAT24(uStack_644 >> 1,CONCAT22(uStack_646 >> 1,local_648 >> 1)));
  uStack_a40 = CONCAT26((ushort)(uVar42 >> 0x31),
                        CONCAT24(uStack_63c >> 1,CONCAT22(uStack_63e >> 1,uStack_640 >> 1)));
  auVar56._8_8_ = uStack_a40;
  auVar56._0_8_ = local_a48;
  auVar56 = paddusb(auVar33,auVar56);
  auVar56 = psubusb(auVar56,auVar5);
  local_768 = auVar56[0];
  cStack_767 = auVar56[1];
  cStack_766 = auVar56[2];
  cStack_765 = auVar56[3];
  cStack_764 = auVar56[4];
  cStack_763 = auVar56[5];
  cStack_762 = auVar56[6];
  cStack_761 = auVar56[7];
  cStack_760 = auVar56[8];
  cStack_75f = auVar56[9];
  cStack_75e = auVar56[10];
  cStack_75d = auVar56[0xb];
  cStack_75c = auVar56[0xc];
  cStack_75b = auVar56[0xd];
  cStack_75a = auVar56[0xe];
  cStack_759 = auVar56[0xf];
  uVar29 = CONCAT17(-(cStack_761 == '\0'),
                    CONCAT16(-(cStack_762 == '\0'),
                             CONCAT15(-(cStack_763 == '\0'),
                                      CONCAT14(-(cStack_764 == '\0'),
                                               CONCAT13(-(cStack_765 == '\0'),
                                                        CONCAT12(-(cStack_766 == '\0'),
                                                                 CONCAT11(-(cStack_767 == '\0'),
                                                                          -(local_768 == '\0')))))))
                   ) ^ 0xffffffffffffffff;
  uVar42 = CONCAT17(-(cStack_759 == '\0'),
                    CONCAT16(-(cStack_75a == '\0'),
                             CONCAT15(-(cStack_75b == '\0'),
                                      CONCAT14(-(cStack_75c == '\0'),
                                               CONCAT13(-(cStack_75d == '\0'),
                                                        CONCAT12(-(cStack_75e == '\0'),
                                                                 CONCAT11(-(cStack_75f == '\0'),
                                                                          -(cStack_760 == '\0'))))))
                            )) ^ 0xffffffffffffffff;
  local_738 = (byte)uVar29;
  bStack_737 = (byte)(uVar29 >> 8);
  bStack_736 = (byte)(uVar29 >> 0x10);
  bStack_735 = (byte)(uVar29 >> 0x18);
  bStack_734 = (byte)(uVar29 >> 0x20);
  bStack_733 = (byte)(uVar29 >> 0x28);
  bStack_732 = (byte)(uVar29 >> 0x30);
  bStack_731 = (byte)(uVar29 >> 0x38);
  bStack_730 = (byte)uVar42;
  bStack_72f = (byte)(uVar42 >> 8);
  bStack_72e = (byte)(uVar42 >> 0x10);
  bStack_72d = (byte)(uVar42 >> 0x18);
  bStack_72c = (byte)(uVar42 >> 0x20);
  bStack_72b = (byte)(uVar42 >> 0x28);
  bStack_72a = (byte)(uVar42 >> 0x30);
  bStack_729 = (byte)(uVar42 >> 0x38);
  local_948._0_2_ =
       CONCAT11((bVar34 < bStack_737) * bStack_737 | (bVar34 >= bStack_737) * bVar34,
                (bVar28 < local_738) * local_738 | (bVar28 >= local_738) * bVar28);
  local_948._0_3_ =
       CONCAT12((bVar35 < bStack_736) * bStack_736 | (bVar35 >= bStack_736) * bVar35,
                (undefined2)local_948);
  local_948._0_4_ =
       CONCAT13((bVar36 < bStack_735) * bStack_735 | (bVar36 >= bStack_735) * bVar36,
                (undefined3)local_948);
  local_948._0_5_ =
       CONCAT14((bVar37 < bStack_734) * bStack_734 | (bVar37 >= bStack_734) * bVar37,
                (undefined4)local_948);
  local_948._0_6_ =
       CONCAT15((bVar38 < bStack_733) * bStack_733 | (bVar38 >= bStack_733) * bVar38,
                (undefined5)local_948);
  local_948._0_7_ =
       CONCAT16((bVar39 < bStack_732) * bStack_732 | (bVar39 >= bStack_732) * bVar39,
                (undefined6)local_948);
  local_948 = CONCAT17((bVar40 < bStack_731) * bStack_731 | (bVar40 >= bStack_731) * bVar40,
                       (undefined7)local_948);
  uStack_940._0_1_ = (bVar41 < bStack_730) * bStack_730 | (bVar41 >= bStack_730) * bVar41;
  uStack_940._1_1_ = (bVar48 < bStack_72f) * bStack_72f | (bVar48 >= bStack_72f) * bVar48;
  uStack_940._2_1_ = (bVar49 < bStack_72e) * bStack_72e | (bVar49 >= bStack_72e) * bVar49;
  uStack_940._3_1_ = (bVar50 < bStack_72d) * bStack_72d | (bVar50 >= bStack_72d) * bVar50;
  uStack_940._4_1_ = (bVar51 < bStack_72c) * bStack_72c | (bVar51 >= bStack_72c) * bVar51;
  uStack_940._5_1_ = (bVar52 < bStack_72b) * bStack_72b | (bVar52 >= bStack_72b) * bVar52;
  uStack_940._6_1_ = (bVar53 < bStack_72a) * bStack_72a | (bVar53 >= bStack_72a) * bVar53;
  uStack_940._7_1_ = (bVar54 < bStack_729) * bStack_729 | (bVar54 >= bStack_729) * bVar54;
  auVar5._8_8_ = uStack_940;
  auVar5._0_8_ = local_948;
  auVar56 = psubusb(auVar5,auVar6);
  local_788 = auVar56[0];
  cStack_787 = auVar56[1];
  cStack_786 = auVar56[2];
  cStack_785 = auVar56[3];
  cStack_784 = auVar56[4];
  cStack_783 = auVar56[5];
  cStack_782 = auVar56[6];
  cStack_781 = auVar56[7];
  cStack_780 = auVar56[8];
  cStack_77f = auVar56[9];
  cStack_77e = auVar56[10];
  cStack_77d = auVar56[0xb];
  cStack_77c = auVar56[0xc];
  cStack_77b = auVar56[0xd];
  cStack_77a = auVar56[0xe];
  cStack_779 = auVar56[0xf];
  local_948._0_2_ = CONCAT11(-(cStack_787 == '\0'),-(local_788 == '\0'));
  local_948._0_3_ = CONCAT12(-(cStack_786 == '\0'),(undefined2)local_948);
  local_948._0_4_ = CONCAT13(-(cStack_785 == '\0'),(undefined3)local_948);
  local_948._0_5_ = CONCAT14(-(cStack_784 == '\0'),(undefined4)local_948);
  local_948._0_6_ = CONCAT15(-(cStack_783 == '\0'),(undefined5)local_948);
  local_948._0_7_ = CONCAT16(-(cStack_782 == '\0'),(undefined6)local_948);
  local_948 = CONCAT17(-(cStack_781 == '\0'),(undefined7)local_948);
  uStack_940._0_1_ = -(cStack_780 == '\0');
  uStack_940._1_1_ = -(cStack_77f == '\0');
  uStack_940._2_1_ = -(cStack_77e == '\0');
  uStack_940._3_1_ = -(cStack_77d == '\0');
  uStack_940._4_1_ = -(cStack_77c == '\0');
  uStack_940._5_1_ = -(cStack_77b == '\0');
  uStack_940._6_1_ = -(cStack_77a == '\0');
  uStack_940._7_1_ = -(cStack_779 == '\0');
  bVar55 = -(-(cStack_779 == '\0') == '\0');
  auVar6[1] = -(-(cStack_787 == '\0') == '\0');
  auVar6[0] = -(-(local_788 == '\0') == '\0');
  auVar6[2] = -(-(cStack_786 == '\0') == '\0');
  auVar6[3] = -(-(cStack_785 == '\0') == '\0');
  auVar6[4] = -(-(cStack_784 == '\0') == '\0');
  auVar6[5] = -(-(cStack_783 == '\0') == '\0');
  auVar6[6] = -(-(cStack_782 == '\0') == '\0');
  auVar6[7] = -(-(cStack_781 == '\0') == '\0');
  auVar6[8] = -(-(cStack_780 == '\0') == '\0');
  auVar6[9] = -(-(cStack_77f == '\0') == '\0');
  auVar6[10] = -(-(cStack_77e == '\0') == '\0');
  auVar6[0xb] = -(-(cStack_77d == '\0') == '\0');
  auVar6[0xc] = -(-(cStack_77c == '\0') == '\0');
  auVar6[0xd] = -(-(cStack_77b == '\0') == '\0');
  auVar6[0xe] = -(-(cStack_77a == '\0') == '\0');
  auVar6[0xf] = bVar55;
  if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(bVar55 >> 7) << 0xf) !=
      0xffff) {
    uVar30 = uVar30 ^ 0x8080808080808080;
    uVar43 = uVar43 ^ 0x8080808080808080;
    uVar31 = uVar31 ^ 0x8080808080808080;
    uVar44 = uVar44 ^ 0x8080808080808080;
    uVar32 = uVar32 ^ 0x8080808080808080;
    uVar45 = uVar45 ^ 0x8080808080808080;
    auVar4[1] = bVar34;
    auVar4[0] = bVar28;
    auVar4[2] = bVar35;
    auVar4[3] = bVar36;
    auVar4[4] = bVar37;
    auVar4[5] = bVar38;
    auVar4[6] = bVar39;
    auVar4[7] = bVar40;
    auVar4[9] = bVar48;
    auVar4[8] = bVar41;
    auVar4[10] = bVar49;
    auVar4[0xb] = bVar50;
    auVar4[0xc] = bVar51;
    auVar4[0xd] = bVar52;
    auVar4[0xe] = bVar53;
    auVar4[0xf] = bVar54;
    auVar56 = psubusb(auVar4,auVar7);
    local_7e8 = auVar56[0];
    cStack_7e7 = auVar56[1];
    cStack_7e6 = auVar56[2];
    cStack_7e5 = auVar56[3];
    cStack_7e4 = auVar56[4];
    cStack_7e3 = auVar56[5];
    cStack_7e2 = auVar56[6];
    cStack_7e1 = auVar56[7];
    cStack_7e0 = auVar56[8];
    cStack_7df = auVar56[9];
    cStack_7de = auVar56[10];
    cStack_7dd = auVar56[0xb];
    cStack_7dc = auVar56[0xc];
    cStack_7db = auVar56[0xd];
    cStack_7da = auVar56[0xe];
    cStack_7d9 = auVar56[0xf];
    uVar29 = CONCAT17(-(cStack_7e1 == '\0'),
                      CONCAT16(-(cStack_7e2 == '\0'),
                               CONCAT15(-(cStack_7e3 == '\0'),
                                        CONCAT14(-(cStack_7e4 == '\0'),
                                                 CONCAT13(-(cStack_7e5 == '\0'),
                                                          CONCAT12(-(cStack_7e6 == '\0'),
                                                                   CONCAT11(-(cStack_7e7 == '\0'),
                                                                            -(local_7e8 == '\0')))))
                                       ))) ^ 0xffffffffffffffff;
    uVar46 = CONCAT17(-(cStack_7d9 == '\0'),
                      CONCAT16(-(cStack_7da == '\0'),
                               CONCAT15(-(cStack_7db == '\0'),
                                        CONCAT14(-(cStack_7dc == '\0'),
                                                 CONCAT13(-(cStack_7dd == '\0'),
                                                          CONCAT12(-(cStack_7de == '\0'),
                                                                   CONCAT11(-(cStack_7df == '\0'),
                                                                            -(cStack_7e0 == '\0'))))
                                                )))) ^ 0xffffffffffffffff;
    auVar14._8_8_ = uVar43;
    auVar14._0_8_ = uVar30;
    auVar13._8_8_ = uVar45;
    auVar13._0_8_ = uVar32;
    auVar56 = psubsb(auVar14,auVar13);
    local_548 = auVar56._0_8_;
    uStack_540 = auVar56._8_8_;
    auVar12._8_8_ = uVar2 ^ 0x8080808080808080;
    auVar12._0_8_ = uVar1 ^ 0x8080808080808080;
    auVar11._8_8_ = uVar44;
    auVar11._0_8_ = uVar31;
    auVar56 = psubsb(auVar12,auVar11);
    auVar25._8_8_ = uStack_540 & uVar46;
    auVar25._0_8_ = local_548 & uVar29;
    auVar33 = paddsb(auVar25,auVar56);
    auVar33 = paddsb(auVar33,auVar56);
    auVar56 = paddsb(auVar33,auVar56);
    local_ad8 = auVar56._0_8_;
    uStack_ad0 = auVar56._8_8_;
    auVar24._8_8_ = uStack_ad0 & uStack_940;
    auVar24._0_8_ = local_ad8 & local_948;
    auVar23._8_8_ = 0x404040404040404;
    auVar23._0_8_ = 0x404040404040404;
    auVar56 = paddsb(auVar24,auVar23);
    auVar22._8_8_ = uStack_ad0 & uStack_940;
    auVar22._0_8_ = local_ad8 & local_948;
    auVar21._8_8_ = 0x303030303030303;
    auVar21._0_8_ = 0x303030303030303;
    auVar33 = paddsb(auVar22,auVar21);
    local_1a8 = auVar56[0];
    cStack_1a7 = auVar56[1];
    cStack_1a6 = auVar56[2];
    cStack_1a5 = auVar56[3];
    cStack_1a4 = auVar56[4];
    cStack_1a3 = auVar56[5];
    cStack_1a2 = auVar56[6];
    cStack_1a1 = auVar56[7];
    cStack_1a0 = auVar56[8];
    cStack_19f = auVar56[9];
    cStack_19e = auVar56[10];
    cStack_19d = auVar56[0xb];
    cStack_19c = auVar56[0xc];
    cStack_19b = auVar56[0xd];
    cStack_19a = auVar56[0xe];
    cStack_199 = auVar56[0xf];
    local_ae8._0_2_ = CONCAT11(-(cStack_1a7 < '\0'),-(local_1a8 < '\0'));
    local_ae8._0_3_ = CONCAT12(-(cStack_1a6 < '\0'),(undefined2)local_ae8);
    local_ae8._0_4_ = CONCAT13(-(cStack_1a5 < '\0'),(undefined3)local_ae8);
    local_ae8._0_5_ = CONCAT14(-(cStack_1a4 < '\0'),(undefined4)local_ae8);
    local_ae8._0_6_ = CONCAT15(-(cStack_1a3 < '\0'),(undefined5)local_ae8);
    local_ae8._0_7_ = CONCAT16(-(cStack_1a2 < '\0'),(undefined6)local_ae8);
    local_ae8 = CONCAT17(-(cStack_1a1 < '\0'),(undefined7)local_ae8);
    uStack_ae0._0_1_ = -(cStack_1a0 < '\0');
    uStack_ae0._1_1_ = -(cStack_19f < '\0');
    uStack_ae0._2_1_ = -(cStack_19e < '\0');
    uStack_ae0._3_1_ = -(cStack_19d < '\0');
    uStack_ae0._4_1_ = -(cStack_19c < '\0');
    uStack_ae0._5_1_ = -(cStack_19b < '\0');
    uStack_ae0._6_1_ = -(cStack_19a < '\0');
    uStack_ae0._7_1_ = -(cStack_199 < '\0');
    local_668 = auVar56._0_2_;
    uStack_666 = auVar56._2_2_;
    uStack_664 = auVar56._4_2_;
    uStack_662 = auVar56._6_2_;
    uStack_660 = auVar56._8_2_;
    uStack_65e = auVar56._10_2_;
    uStack_65c = auVar56._12_2_;
    uStack_65a = auVar56._14_2_;
    local_af8._0_4_ = CONCAT22(uStack_666 >> 3,local_668 >> 3);
    local_af8._0_6_ = CONCAT24(uStack_664 >> 3,(undefined4)local_af8);
    local_af8 = CONCAT26(uStack_662 >> 3,(undefined6)local_af8);
    uStack_af0._0_2_ = uStack_660 >> 3;
    uStack_af0._2_2_ = uStack_65e >> 3;
    uStack_af0._4_2_ = uStack_65c >> 3;
    uStack_af0._6_2_ = uStack_65a >> 3;
    uVar42 = local_af8 & 0x1f1f1f1f1f1f1f1f | local_ae8 & 0xe0e0e0e0e0e0e0e0;
    uVar47 = uStack_af0 & 0x1f1f1f1f1f1f1f1f | uStack_ae0 & 0xe0e0e0e0e0e0e0e0;
    auVar10._8_8_ = uVar2 ^ 0x8080808080808080;
    auVar10._0_8_ = uVar1 ^ 0x8080808080808080;
    auVar9._8_8_ = uVar47;
    auVar9._0_8_ = uVar42;
    auVar56 = psubsb(auVar10,auVar9);
    local_448 = auVar56._0_8_;
    uStack_440 = auVar56._8_8_;
    local_1c8 = auVar33[0];
    cStack_1c7 = auVar33[1];
    cStack_1c6 = auVar33[2];
    cStack_1c5 = auVar33[3];
    cStack_1c4 = auVar33[4];
    cStack_1c3 = auVar33[5];
    cStack_1c2 = auVar33[6];
    cStack_1c1 = auVar33[7];
    cStack_1c0 = auVar33[8];
    cStack_1bf = auVar33[9];
    cStack_1be = auVar33[10];
    cStack_1bd = auVar33[0xb];
    cStack_1bc = auVar33[0xc];
    cStack_1bb = auVar33[0xd];
    cStack_1ba = auVar33[0xe];
    cStack_1b9 = auVar33[0xf];
    local_ae8._0_2_ = CONCAT11(-(cStack_1c7 < '\0'),-(local_1c8 < '\0'));
    local_ae8._0_3_ = CONCAT12(-(cStack_1c6 < '\0'),(undefined2)local_ae8);
    local_ae8._0_4_ = CONCAT13(-(cStack_1c5 < '\0'),(undefined3)local_ae8);
    local_ae8._0_5_ = CONCAT14(-(cStack_1c4 < '\0'),(undefined4)local_ae8);
    local_ae8._0_6_ = CONCAT15(-(cStack_1c3 < '\0'),(undefined5)local_ae8);
    local_ae8._0_7_ = CONCAT16(-(cStack_1c2 < '\0'),(undefined6)local_ae8);
    local_ae8 = CONCAT17(-(cStack_1c1 < '\0'),(undefined7)local_ae8);
    uStack_ae0._0_1_ = -(cStack_1c0 < '\0');
    uStack_ae0._1_1_ = -(cStack_1bf < '\0');
    uStack_ae0._2_1_ = -(cStack_1be < '\0');
    uStack_ae0._3_1_ = -(cStack_1bd < '\0');
    uStack_ae0._4_1_ = -(cStack_1bc < '\0');
    uStack_ae0._5_1_ = -(cStack_1bb < '\0');
    uStack_ae0._6_1_ = -(cStack_1ba < '\0');
    uStack_ae0._7_1_ = -(cStack_1b9 < '\0');
    local_688 = auVar33._0_2_;
    uStack_686 = auVar33._2_2_;
    uStack_684 = auVar33._4_2_;
    uStack_682 = auVar33._6_2_;
    uStack_680 = auVar33._8_2_;
    uStack_67e = auVar33._10_2_;
    uStack_67c = auVar33._12_2_;
    uStack_67a = auVar33._14_2_;
    local_b08._0_4_ = CONCAT22(uStack_686 >> 3,local_688 >> 3);
    local_b08._0_6_ = CONCAT24(uStack_684 >> 3,(undefined4)local_b08);
    local_b08 = CONCAT26(uStack_682 >> 3,(undefined6)local_b08);
    uStack_b00._0_2_ = uStack_680 >> 3;
    uStack_b00._2_2_ = uStack_67e >> 3;
    uStack_b00._4_2_ = uStack_67c >> 3;
    uStack_b00._6_2_ = uStack_67a >> 3;
    auVar20._8_8_ = uVar44;
    auVar20._0_8_ = uVar31;
    auVar19._8_8_ = uStack_b00 & 0x1f1f1f1f1f1f1f1f | uStack_ae0 & 0xe0e0e0e0e0e0e0e0;
    auVar19._0_8_ = local_b08 & 0x1f1f1f1f1f1f1f1f | local_ae8 & 0xe0e0e0e0e0e0e0e0;
    auVar56 = paddsb(auVar20,auVar19);
    local_468 = auVar56._0_8_;
    uStack_460 = auVar56._8_8_;
    auVar18._8_8_ = uVar47;
    auVar18._0_8_ = uVar42;
    auVar17._8_8_ = 0x101010101010101;
    auVar17._0_8_ = 0x101010101010101;
    auVar56 = paddsb(auVar18,auVar17);
    local_1e8 = auVar56[0];
    cStack_1e7 = auVar56[1];
    cStack_1e6 = auVar56[2];
    cStack_1e5 = auVar56[3];
    cStack_1e4 = auVar56[4];
    cStack_1e3 = auVar56[5];
    cStack_1e2 = auVar56[6];
    cStack_1e1 = auVar56[7];
    cStack_1e0 = auVar56[8];
    cStack_1df = auVar56[9];
    cStack_1de = auVar56[10];
    cStack_1dd = auVar56[0xb];
    cStack_1dc = auVar56[0xc];
    cStack_1db = auVar56[0xd];
    cStack_1da = auVar56[0xe];
    cStack_1d9 = auVar56[0xf];
    local_ae8._0_2_ = CONCAT11(-(cStack_1e7 < '\0'),-(local_1e8 < '\0'));
    local_ae8._0_3_ = CONCAT12(-(cStack_1e6 < '\0'),(undefined2)local_ae8);
    local_ae8._0_4_ = CONCAT13(-(cStack_1e5 < '\0'),(undefined3)local_ae8);
    local_ae8._0_5_ = CONCAT14(-(cStack_1e4 < '\0'),(undefined4)local_ae8);
    local_ae8._0_6_ = CONCAT15(-(cStack_1e3 < '\0'),(undefined5)local_ae8);
    local_ae8._0_7_ = CONCAT16(-(cStack_1e2 < '\0'),(undefined6)local_ae8);
    local_ae8 = CONCAT17(-(cStack_1e1 < '\0'),(undefined7)local_ae8);
    uStack_ae0._0_1_ = -(cStack_1e0 < '\0');
    uStack_ae0._1_1_ = -(cStack_1df < '\0');
    uStack_ae0._2_1_ = -(cStack_1de < '\0');
    uStack_ae0._3_1_ = -(cStack_1dd < '\0');
    uStack_ae0._4_1_ = -(cStack_1dc < '\0');
    uStack_ae0._5_1_ = -(cStack_1db < '\0');
    uStack_ae0._6_1_ = -(cStack_1da < '\0');
    uStack_ae0._7_1_ = -(cStack_1d9 < '\0');
    local_6a8 = auVar56._0_2_;
    uStack_6a6 = auVar56._2_2_;
    uStack_6a4 = auVar56._4_2_;
    uStack_6a2 = auVar56._6_2_;
    uStack_6a0 = auVar56._8_2_;
    uStack_69e = auVar56._10_2_;
    uStack_69c = auVar56._12_2_;
    uStack_69a = auVar56._14_2_;
    local_ad8._0_4_ = CONCAT22(uStack_6a6 >> 1,local_6a8 >> 1);
    local_ad8._0_6_ = CONCAT24(uStack_6a4 >> 1,(undefined4)local_ad8);
    local_ad8 = CONCAT26(uStack_6a2 >> 1,(undefined6)local_ad8);
    uStack_ad0._0_2_ = uStack_6a0 >> 1;
    uStack_ad0._2_2_ = uStack_69e >> 1;
    uStack_ad0._4_2_ = uStack_69c >> 1;
    uStack_ad0._6_2_ = uStack_69a >> 1;
    uVar31 = local_ad8 & 0x7f7f7f7f7f7f7f7f | local_ae8 & 0x8080808080808080;
    uVar44 = uStack_ad0 & 0x7f7f7f7f7f7f7f7f | uStack_ae0 & 0x8080808080808080;
    local_118 = (uint)uVar29;
    uStack_114 = (uint)(uVar29 >> 0x20);
    uStack_110 = (uint)uVar46;
    uStack_10c = (uint)(uVar46 >> 0x20);
    local_128 = (uint)uVar31;
    uStack_124 = (uint)(uVar31 >> 0x20);
    uStack_120 = (uint)uVar44;
    uStack_11c = (uint)(uVar44 >> 0x20);
    local_ad8 = CONCAT44((uStack_114 ^ 0xffffffff) & uStack_124,(local_118 ^ 0xffffffff) & local_128
                        );
    uStack_ad0._0_4_ = (uStack_110 ^ 0xffffffff) & uStack_120;
    uStack_ad0._4_4_ = (uStack_10c ^ 0xffffffff) & uStack_11c;
    auVar16._8_8_ = uVar43;
    auVar16._0_8_ = uVar30;
    auVar15._8_8_ = uStack_ad0;
    auVar15._0_8_ = local_ad8;
    auVar56 = paddsb(auVar16,auVar15);
    local_488 = auVar56._0_8_;
    uStack_480 = auVar56._8_8_;
    auVar8._8_8_ = uVar45;
    auVar8._0_8_ = uVar32;
    auVar7._8_8_ = uStack_ad0;
    auVar7._0_8_ = local_ad8;
    auVar56 = psubsb(auVar8,auVar7);
    local_4a8 = auVar56._0_8_;
    uStack_4a0 = auVar56._8_8_;
    puVar26 = (ulong *)((long)in_RDI - (long)(iVar27 << 1));
    *puVar26 = local_488 ^ 0x8080808080808080;
    puVar26[1] = uStack_480 ^ 0x8080808080808080;
    *(ulong *)((long)in_RDI - (long)iVar27) = local_468 ^ 0x8080808080808080;
    ((ulong *)((long)in_RDI - (long)iVar27))[1] = uStack_460 ^ 0x8080808080808080;
    *in_RDI = local_448 ^ 0x8080808080808080;
    in_RDI[1] = uStack_440 ^ 0x8080808080808080;
    *(ulong *)((long)in_RDI + (long)iVar27) = local_4a8 ^ 0x8080808080808080;
    ((ulong *)((long)in_RDI + (long)iVar27))[1] = uStack_4a0 ^ 0x8080808080808080;
  }
  return;
}

Assistant:

void aom_lpf_horizontal_4_quad_sse2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i blimit_v = _mm_load_si128((const __m128i *)_blimit0);
  const __m128i limit_v = _mm_load_si128((const __m128i *)_limit0);
  const __m128i thresh_v = _mm_load_si128((const __m128i *)_thresh0);
  __m128i mask, hev;
  __m128i p1, p0, q0, q1;

  __m128i op1, op0, oq0, oq1;

  __m128i max_abs_p1p0q1q0;

  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));

  {
    const __m128i abs_p1p0 = abs_diff(p1, p0);
    const __m128i abs_q1q0 = abs_diff(q1, q0);
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i ff = _mm_cmpeq_epi8(zero, zero);
    __m128i abs_p0q0 = abs_diff(p0, q0);
    __m128i abs_p1q1 = abs_diff(p1, q1);
    max_abs_p1p0q1q0 = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(max_abs_p1p0q1q0, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
  // filter4
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i ff = _mm_cmpeq_epi8(t4, t4);

    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;

    op1 = _mm_xor_si128(p1, t80);
    op0 = _mm_xor_si128(p0, t80);
    oq0 = _mm_xor_si128(q0, t80);
    oq1 = _mm_xor_si128(q1, t80);

    hev = _mm_subs_epu8(max_abs_p1p0q1q0, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);
    filt = _mm_and_si128(_mm_subs_epi8(op1, oq1), hev);

    work_a = _mm_subs_epi8(oq0, op0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);
    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    oq0 = _mm_xor_si128(_mm_subs_epi8(oq0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    op0 = _mm_xor_si128(_mm_adds_epi8(op0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    op1 = _mm_xor_si128(_mm_adds_epi8(op1, filt), t80);
    oq1 = _mm_xor_si128(_mm_subs_epi8(oq1, filt), t80);

    _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
    _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
    _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
    _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
  }
}